

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

void htmlAutoCloseOnEnd(htmlParserCtxtPtr ctxt)

{
  endElementSAXFunc p_Var1;
  int iVar2;
  
  iVar2 = ctxt->nameNr;
  if (iVar2 != 0) {
    for (; 0 < iVar2; iVar2 = iVar2 + -1) {
      if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
         (p_Var1 = ctxt->sax->endElement, p_Var1 != (endElementSAXFunc)0x0)) {
        (*p_Var1)(ctxt->userData,ctxt->name);
      }
      htmlnamePop(ctxt);
    }
  }
  return;
}

Assistant:

static void
htmlAutoCloseOnEnd(htmlParserCtxtPtr ctxt)
{
    int i;

    if (ctxt->nameNr == 0)
        return;
    for (i = (ctxt->nameNr - 1); i >= 0; i--) {
        if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL))
            ctxt->sax->endElement(ctxt->userData, ctxt->name);
	htmlnamePop(ctxt);
    }
}